

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O0

void __thiscall
flow::lang::ScopedSym::ScopedSym
          (ScopedSym *this,Type t,SymbolTable *outer,string *name,SourceLocation *loc)

{
  SourceLocation *loc_local;
  string *name_local;
  SymbolTable *outer_local;
  undefined1 auStack_10 [4];
  Type t_local;
  ScopedSym *this_local;
  
  name_local = (string *)outer;
  outer_local._4_4_ = t;
  _auStack_10 = this;
  Symbol::Symbol(&this->super_Symbol,t,name,loc);
  (this->super_Symbol).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ScopedSym_002b8690;
  std::make_unique<flow::lang::SymbolTable,flow::lang::SymbolTable*&,std::__cxx11::string_const&>
            ((SymbolTable **)&this->scope_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name_local);
  return;
}

Assistant:

ScopedSym(Type t, SymbolTable* outer, const std::string& name,
            const SourceLocation& loc)
      : Symbol(t, name, loc), scope_(std::make_unique<SymbolTable>(outer, name)) {}